

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

int Acb_ComputeSuppCost(Vec_Int_t *vSupp,Vec_Int_t *vWeights,int iFirstDiv)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  if ((long)vSupp->nSize < 1) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    do {
      if (vSupp->pArray[lVar2] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar3 = ((uint)vSupp->pArray[lVar2] >> 1) - iFirstDiv;
      if (((int)uVar3 < 0) || (vWeights->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = iVar1 + vWeights->pArray[uVar3];
      lVar2 = lVar2 + 1;
    } while (vSupp->nSize != lVar2);
  }
  return iVar1;
}

Assistant:

int Acb_ComputeSuppCost( Vec_Int_t * vSupp, Vec_Int_t * vWeights, int iFirstDiv )
{
    int i, Entry, Cost = 0;
    Vec_IntForEachEntry( vSupp, Entry, i )
        Cost += Vec_IntEntry( vWeights, Abc_Lit2Var(Entry) - iFirstDiv );
    return Cost;
}